

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_DP2ADD(Context *ctx)

{
  size_t in_RCX;
  char extra [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  
  make_METAL_srcarg_string_vec2(ctx,0,src0,in_RCX);
  make_METAL_srcarg_string_vec2(ctx,1,src1,in_RCX);
  make_METAL_srcarg_string_scalar(ctx,2,src2,in_RCX);
  snprintf(extra,0x40," + %s",src2);
  emit_METAL_dotprod(ctx,src0,src1,extra);
  return;
}

Assistant:

EMIT_METAL_OPCODE_UNIMPLEMENTED_FUNC(BEM) // !!! FIXME

static void emit_METAL_DP2ADD(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_vec2(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_vec2(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_METAL_srcarg_string_scalar(ctx, 2, src2, sizeof (src2));
    char extra[64]; snprintf(extra, sizeof (extra), " + %s", src2);
    emit_METAL_dotprod(ctx, src0, src1, extra);
}